

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void runtest(int n,char *filename1,char *arg2)

{
  allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_> *this;
  initializer_list<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  size_type sVar5;
  element_type *peVar6;
  runtime_error *this_00;
  pointer ppVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  allocator<char> local_8b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  _Self local_878;
  _Self local_870;
  iterator fn;
  pair<const_int,_void_(*)(QPDF_&,_const_char_*)> local_860 [101];
  iterator local_210;
  size_type local_208;
  undefined1 local_200 [8];
  map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
  test_functions;
  size_t size_1;
  string local_1c0 [39];
  allocator<char> local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  char *local_158;
  size_t i;
  char *p;
  size_t size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string filename;
  FILE *filep;
  shared_ptr<char> file_buf;
  QPDF pdf;
  QPDFObjectHandle uninitialized;
  undefined1 local_c0 [8];
  string password;
  allocator<int> local_8a;
  less<int> local_89;
  int local_88 [10];
  iterator local_60;
  size_type local_58;
  undefined1 local_50 [8];
  set<int,_std::less<int>,_std::allocator<int>_> ignore_filename;
  char *arg2_local;
  char *filename1_local;
  int n_local;
  
  local_88[8] = 0x5f;
  local_88[9] = 0x60;
  local_88[4] = 0x55;
  local_88[5] = 0x56;
  local_88[6] = 0x57;
  local_88[7] = 0x5c;
  local_88[0] = 0x3d;
  local_88[1] = 0x51;
  local_88[2] = 0x53;
  local_88[3] = 0x54;
  local_60 = local_88;
  local_58 = 10;
  ignore_filename._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)arg2;
  filename1_local._4_4_ = n;
  std::allocator<int>::allocator(&local_8a);
  __l_00._M_len = local_58;
  __l_00._M_array = local_60;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50,__l_00,&local_89,&local_8a);
  std::allocator<int>::~allocator(&local_8a);
  if (filename1_local._4_4_ == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c0,anon_var_dwarf_190c9,
               (allocator<char> *)
               ((long)&uninitialized.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uninitialized.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0x20) {
      __assert_fail("password.length() == 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xdff,"void runtest(int, const char *, const char *)");
    }
    QPDF::trim_user_password((string *)local_c0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,"1234567890123456789012(45678");
    if (!bVar1) {
      __assert_fail("password == \"1234567890123456789012(45678\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe01,"void runtest(int, const char *, const char *)");
    }
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&pdf);
    iVar2 = QPDFObjectHandle::getTypeCode();
    if (iVar2 != 0) {
      __assert_fail("uninitialized.getTypeCode() == ::ot_uninitialized",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe04,"void runtest(int, const char *, const char *)");
    }
    pcVar4 = (char *)QPDFObjectHandle::getTypeName();
    iVar2 = strcmp(pcVar4,"uninitialized");
    if (iVar2 != 0) {
      __assert_fail("strcmp(uninitialized.getTypeName(), \"uninitialized\") == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0xe05,"void runtest(int, const char *, const char *)");
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&pdf);
    std::__cxx11::string::~string((string *)local_c0);
  }
  QPDF::QPDF((QPDF *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<char>::shared_ptr((shared_ptr<char> *)&filep);
  filename.field_2._8_8_ = 0;
  if (filename1_local._4_4_ == 0) {
    QPDF::setAttemptRecovery((bool)((char)&file_buf + '\b'));
  }
  if (((filename1_local._4_4_ == 0x23) || (filename1_local._4_4_ == 0x24)) &&
     (ignore_filename._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    QPDF::processFile((char *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,filename1);
  }
  else if (filename1_local._4_4_ == 0x2d) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_138,filename1,(allocator<char> *)((long)&size + 7));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   &local_138,".obfuscated");
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator((allocator<char> *)((long)&size + 7));
    p = (char *)0x0;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    QUtil::read_file_into_memory(pcVar4,(shared_ptr *)&filep,(ulong *)&p);
    i = (size_t)std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&filep);
    for (local_158 = (char *)0x0; local_158 < p; local_158 = local_158 + 1) {
      *(byte *)(i + (long)local_158) = *(byte *)(i + (long)local_158) ^ 0xcc;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,filename1,&local_199);
    std::operator+(&local_178,&local_198,".pdf");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    QPDF::processMemoryFile
              ((char *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               pcVar4,i,p);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator(&local_199);
    std::__cxx11::string::~string((string *)local_118);
  }
  else {
    sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50,
                       (key_type *)((long)&filename1_local + 4));
    if (sVar5 == 0) {
      if (filename1_local._4_4_ == 0x59) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1c0,filename1,(allocator<char> *)((long)&size_1 + 7));
        QPDF::createFromJSON
                  ((string *)
                   &file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&size_1 + 7));
      }
      else if (filename1_local._4_4_ % 2 == 0) {
        if (filename1_local._4_4_ % 4 == 0) {
          QTC::TC("qpdf","exercise processFile(name)",0);
          QPDF::processFile((char *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount,filename1);
        }
        else {
          QTC::TC("qpdf","exercise processFile(FILE*)",0);
          filename.field_2._8_8_ = QUtil::safe_fopen(filename1,"rb");
          QPDF::processFile((char *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount,(_IO_FILE *)filename1,
                            SUB81(filename.field_2._8_8_,0),(char *)0x0);
        }
      }
      else {
        QTC::TC("qpdf","exercise processMemoryFile",0);
        test_functions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        QUtil::read_file_into_memory
                  (filename1,(shared_ptr *)&filep,
                   &test_functions._M_t._M_impl.super__Rb_tree_header._M_node_count);
        peVar6 = std::__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>::get
                           ((__shared_ptr<char,_(__gnu_cxx::_Lock_policy)2> *)&filep);
        QPDF::processMemoryFile
                  ((char *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount,filename1,(ulong)peVar6,
                   (char *)test_functions._M_t._M_impl.super__Rb_tree_header._M_node_count);
      }
    }
  }
  memcpy(local_860,&DAT_0018d050,0x650);
  local_208 = 0x65;
  this = (allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_> *)((long)&fn._M_node + 6)
  ;
  local_210 = local_860;
  std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>::allocator(this);
  __l._M_len = local_208;
  __l._M_array = local_210;
  std::
  map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
  ::map((map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
         *)local_200,__l,(less<int> *)((long)&fn._M_node + 7),this);
  std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>::~allocator
            ((allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_> *)
             ((long)&fn._M_node + 6));
  local_870._M_node =
       (_Base_ptr)
       std::
       map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
       ::find((map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
               *)local_200,(key_type *)((long)&filename1_local + 4));
  local_878._M_node =
       (_Base_ptr)
       std::
       map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
       ::end((map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
              *)local_200);
  bVar1 = std::operator==(&local_870,&local_878);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8b8,"invalid test ",&local_8b9);
    QUtil::int_to_string_abi_cxx11_((longlong)&local_8e0,filename1_local._4_4_);
    std::operator+(&local_898,&local_8b8,&local_8e0);
    std::runtime_error::runtime_error(this_00,(string *)&local_898);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>::operator->
                     (&local_870);
  (*ppVar7->second)((QPDF *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,
                    (char *)ignore_filename._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (filename.field_2._8_8_ != 0) {
    fclose((FILE *)filename.field_2._8_8_);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"test ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,filename1_local._4_4_);
  poVar8 = std::operator<<(poVar8," done");
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  std::
  map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
  ::~map((map<int,_void_(*)(QPDF_&,_const_char_*),_std::less<int>,_std::allocator<std::pair<const_int,_void_(*)(QPDF_&,_const_char_*)>_>_>
          *)local_200);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)&filep);
  QPDF::~QPDF((QPDF *)&file_buf.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void
runtest(int n, char const* filename1, char const* arg2)
{
    // Most tests here are crafted to work on specific files.  Look at
    // the test suite to see how the test is invoked to find the file
    // that the test is supposed to operate on.

    std::set<int> ignore_filename = {61, 81, 83, 84, 85, 86, 87, 92, 95, 96};

    if (n == 0) {
        // Throw in some random test cases that don't fit anywhere
        // else.  This is in addition to whatever else is going on in
        // test 0.

        // The code to trim user passwords looks for 0x28 (which is
        // "(") since it marks the beginning of the padding.  Exercise
        // the code to make sure it skips over 0x28 characters that
        // aren't part of padding.
        std::string password("1234567890123456789012(45678\x28\xbf\x4e\x5e");
        assert(password.length() == 32);
        QPDF::trim_user_password(password);
        assert(password == "1234567890123456789012(45678");

        QPDFObjectHandle uninitialized;
        assert(uninitialized.getTypeCode() == ::ot_uninitialized);
        assert(strcmp(uninitialized.getTypeName(), "uninitialized") == 0);
    }

    QPDF pdf;
    std::shared_ptr<char> file_buf;
    FILE* filep = nullptr;
    if (n == 0) {
        pdf.setAttemptRecovery(false);
    }
    if (((n == 35) || (n == 36)) && (arg2 != nullptr)) {
        // arg2 is password
        pdf.processFile(filename1, arg2);
    } else if (n == 45) {
        // Decode obfuscated files. To obfuscated, run the input file
        // through this perl script, and save the result to
        // filename.obfuscated. This pretends that the input was
        // called filename.pdf and that that file contained the
        // deobfuscated version.

        // undef $/;
        // my @str = split('', <STDIN>);
        // for (my $i = 0; $i < scalar(@str); ++$i)
        // {
        //     $str[$i] = chr(ord($str[$i]) ^ 0xcc);
        // }
        // print(join('', @str));

        std::string filename(std::string(filename1) + ".obfuscated");
        size_t size = 0;
        QUtil::read_file_into_memory(filename.c_str(), file_buf, size);
        char* p = file_buf.get();
        for (size_t i = 0; i < size; ++i) {
            p[i] = static_cast<char>(p[i] ^ 0xcc);
        }
        pdf.processMemoryFile((std::string(filename1) + ".pdf").c_str(), p, size);
    } else if (ignore_filename.count(n)) {
        // Ignore filename argument entirely
    } else if (n == 89) {
        pdf.createFromJSON(filename1);
    } else if (n % 2 == 0) {
        if (n % 4 == 0) {
            QTC::TC("qpdf", "exercise processFile(name)");
            pdf.processFile(filename1);
        } else {
            QTC::TC("qpdf", "exercise processFile(FILE*)");
            filep = QUtil::safe_fopen(filename1, "rb");
            pdf.processFile(filename1, filep, false);
        }
    } else {
        QTC::TC("qpdf", "exercise processMemoryFile");
        size_t size = 0;
        QUtil::read_file_into_memory(filename1, file_buf, size);
        pdf.processMemoryFile(filename1, file_buf.get(), size);
    }

    std::map<int, void (*)(QPDF&, char const*)> test_functions = {
        {0, test_0_1}, {1, test_0_1}, {2, test_2},   {3, test_3},   {4, test_4},    {5, test_5},
        {6, test_6},   {7, test_7},   {8, test_8},   {9, test_9},   {10, test_10},  {11, test_11},
        {12, test_12}, {13, test_13}, {14, test_14}, {15, test_15}, {16, test_16},  {17, test_17},
        {18, test_18}, {19, test_19}, {20, test_20}, {21, test_21}, {22, test_22},  {23, test_23},
        {24, test_24}, {25, test_25}, {26, test_26}, {27, test_27}, {28, test_28},  {29, test_29},
        {30, test_30}, {31, test_31}, {32, test_32}, {33, test_33}, {34, test_34},  {35, test_35},
        {36, test_36}, {37, test_37}, {38, test_38}, {39, test_39}, {40, test_40},  {41, test_41},
        {42, test_42}, {43, test_43}, {44, test_44}, {45, test_45}, {46, test_46},  {47, test_47},
        {48, test_48}, {49, test_49}, {50, test_50}, {51, test_51}, {52, test_52},  {53, test_53},
        {54, test_54}, {55, test_55}, {56, test_56}, {57, test_57}, {58, test_58},  {59, test_59},
        {60, test_60}, {61, test_61}, {62, test_62}, {63, test_63}, {64, test_64},  {65, test_65},
        {66, test_66}, {67, test_67}, {68, test_68}, {69, test_69}, {70, test_70},  {71, test_71},
        {72, test_72}, {73, test_73}, {74, test_74}, {75, test_75}, {76, test_76},  {77, test_77},
        {78, test_78}, {79, test_79}, {80, test_80}, {81, test_81}, {82, test_82},  {83, test_83},
        {84, test_84}, {85, test_85}, {86, test_86}, {87, test_87}, {88, test_88},  {89, test_89},
        {90, test_90}, {91, test_91}, {92, test_92}, {93, test_93}, {94, test_94},  {95, test_95},
        {96, test_96}, {97, test_97}, {98, test_98}, {99, test_99}, {100, test_100}};

    auto fn = test_functions.find(n);
    if (fn == test_functions.end()) {
        throw std::runtime_error(std::string("invalid test ") + QUtil::int_to_string(n));
    }
    (fn->second)(pdf, arg2);

    if (filep) {
        fclose(filep);
    }
    std::cout << "test " << n << " done" << std::endl;
}